

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

bool mkvmuxer::WriteEbmlDateElement(IMkvWriter *writer,uint64 type,int64 value)

{
  int32 iVar1;
  int iVar2;
  int32 bit_count;
  long lVar3;
  bool bVar4;
  uint8 b;
  undefined1 local_29;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  iVar1 = WriteID(writer,type);
  if ((iVar1 == 0) && (iVar1 = SerializeInt(writer,0x88,1), iVar1 == 0)) {
    lVar3 = 0x38;
    do {
      local_29 = (undefined1)(value >> ((byte)lVar3 & 0x3f));
      iVar2 = (**writer->_vptr_IMkvWriter)(writer,&local_29,1);
      if (iVar2 < 0) goto LAB_0015855b;
      lVar3 = lVar3 + -8;
    } while (lVar3 != -8);
    iVar2 = 0;
LAB_0015855b:
    bVar4 = iVar2 == 0;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool WriteEbmlDateElement(IMkvWriter* writer, uint64 type, int64 value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, kDateElementSize))
    return false;

  if (SerializeInt(writer, value, kDateElementSize))
    return false;

  return true;
}